

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O2

int Abc_NtkRRProve(Abc_RRMan_t *p)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pAVar2;
  abctime aVar3;
  abctime aVar4;
  Abc_Obj_t *pFanout;
  
  pNtk = Abc_NtkDup(p->pWnd);
  if (p->pFanout == (Abc_Obj_t *)0x0) {
    pFanout = (Abc_Obj_t *)0x0;
  }
  else {
    pFanout = (((p->pFanout->field_6).pCopy)->field_6).pCopy;
  }
  Abc_NtkRRUpdate(pNtk,(((p->pNode->field_6).pCopy)->field_6).pCopy,
                  (((p->pFanin->field_6).pCopy)->field_6).pCopy,pFanout);
  iVar1 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar1 == 0) {
    Abc_NtkReassignIds(pNtk);
  }
  pAVar2 = Abc_NtkMiter(p->pWnd,pNtk,1,0,0,0);
  p->pMiter = pAVar2;
  Abc_NtkDelete(pNtk);
  aVar3 = Abc_Clock();
  iVar1 = Abc_NtkMiterProve(&p->pMiter,p->pParams);
  aVar4 = Abc_Clock();
  p->timeProve = p->timeProve + (aVar4 - aVar3);
  return (int)(iVar1 == 1);
}

Assistant:

int Abc_NtkRRProve( Abc_RRMan_t * p )
{
    Abc_Ntk_t * pWndCopy;
    int RetValue;
    abctime clk;
//    Abc_NtkShowAig( p->pWnd, 0 );
    pWndCopy = Abc_NtkDup( p->pWnd );
    Abc_NtkRRUpdate( pWndCopy, p->pNode->pCopy->pCopy, p->pFanin->pCopy->pCopy, p->pFanout? p->pFanout->pCopy->pCopy : NULL );
    if ( !Abc_NtkIsDfsOrdered(pWndCopy) )
        Abc_NtkReassignIds(pWndCopy);
    p->pMiter = Abc_NtkMiter( p->pWnd, pWndCopy, 1, 0, 0, 0 );
    Abc_NtkDelete( pWndCopy );
clk = Abc_Clock();
    RetValue  = Abc_NtkMiterProve( &p->pMiter, p->pParams );
p->timeProve += Abc_Clock() - clk;
    if ( RetValue == 1 )
        return 1;
    return 0;
}